

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::OnAssertUninstantiableCommand
          (CommandRunner *this,AssertUninstantiableCommand *command)

{
  string_view module_filename;
  Ref *pRVar1;
  Enum EVar2;
  bool bVar3;
  RefVec imports;
  Errors errors;
  Ptr local_a8;
  Ptr local_88;
  Ptr local_70;
  RefVec local_58;
  Errors local_38;
  
  local_38.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  module_filename.data_ = (command->filename)._M_dataplus._M_p;
  module_filename.size_ = (command->filename)._M_string_length;
  ReadModule(&local_88,this,module_filename,&local_38);
  if (local_88.obj_ == (Module *)0x0) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line,
               "unable to compile uninstantiable module: \"%s\"",
               (command->filename)._M_dataplus._M_p);
    EVar2 = Error;
  }
  else {
    local_58.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopulateImports(this,&local_88,&local_58);
    local_a8.root_index_ = 0;
    local_a8.obj_ = (Trap *)0x0;
    local_a8.store_ = (Store *)0x0;
    if (local_88.store_ == (Store *)0x0) {
      pRVar1 = (Ref *)&wabt::interp::Ref::Null;
    }
    else {
      pRVar1 = wabt::interp::FreeList<wabt::interp::Ref>::Get
                         (&(local_88.store_)->roots_,local_88.root_index_);
    }
    wabt::interp::Instance::Instantiate
              (&local_70,&this->store_,(Ref)pRVar1->index,&local_58,&local_a8);
    bVar3 = local_a8.obj_ == (Trap *)0x0;
    if (bVar3) {
      PrintError(this,(command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line,
                 "expected module to be uninstantiable: \"%s\"",(command->filename)._M_dataplus._M_p
                );
    }
    EVar2 = (Enum)bVar3;
    if (local_70.obj_ != (Instance *)0x0) {
      wabt::interp::Store::DeleteRoot(local_70.store_,local_70.root_index_);
    }
    if (local_a8.obj_ != (Trap *)0x0) {
      wabt::interp::Store::DeleteRoot(local_a8.store_,local_a8.root_index_);
    }
    if (local_58.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_88.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_88.store_,local_88.root_index_);
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_38);
  return (Result)EVar2;
}

Assistant:

wabt::Result CommandRunner::OnAssertUninstantiableCommand(
    const AssertUninstantiableCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);

  if (!module) {
    PrintError(command->line, "unable to compile uninstantiable module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (!trap) {
    PrintError(command->line, "expected module to be uninstantiable: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  // TODO: print error when assertion passes.
#if 0
  PrintError(command->line, "assert_uninstantiable passed: %s",
             trap->message().c_str());
#endif
  return wabt::Result::Ok;
}